

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fVerbose)

{
  ushort uVar1;
  Abc_Nam_t *p_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *p_03;
  Vec_Wrd_t *pVVar6;
  Wlc_Obj_t *p_04;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pWVar8;
  Vec_Wrd_t *pVVar9;
  word wVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  Vec_Ptr_t *__s;
  uint uVar18;
  char *pcVar19;
  word wVar20;
  bool bVar21;
  double dVar22;
  
  p_01 = Vec_IntAlloc(0x36);
  p_01->nSize = 0x36;
  __s = (Vec_Ptr_t *)p_01->pArray;
  memset(__s,0,0xd8);
  p_02 = Vec_PtrStart((int)__s);
  p_03 = Vec_PtrStart((int)__s);
  for (iVar16 = 0; iVar16 != 0x36; iVar16 = iVar16 + 1) {
    pVVar6 = Vec_WrdAlloc((int)__s);
    __s = p_02;
    Vec_PtrWriteEntry(p_02,iVar16,pVVar6);
  }
  for (iVar16 = 0; iVar16 != 0x36; iVar16 = iVar16 + 1) {
    pVVar6 = Vec_WrdAlloc((int)__s);
    __s = p_03;
    Vec_PtrWriteEntry(p_03,iVar16,pVVar6);
  }
  uVar18 = 1;
  iVar16 = 0;
  pWVar8 = (Wlc_Obj_t *)0x0;
  do {
    if (p->iObj <= (int)uVar18) {
      if (iVar16 != 0) {
        printf("Warning: %d objects of the design have non-zero-based ranges.\n");
        uVar11 = ((long)pWVar8 - (long)p->pObjs) / 0x18;
        p_00 = p->pManName;
        iVar16 = Vec_IntEntry(&p->vNameIds,(int)uVar11);
        pcVar12 = Abc_NamStr(p_00,iVar16);
        iVar15 = pWVar8->End - pWVar8->Beg;
        iVar16 = -iVar15;
        if (0 < iVar15) {
          iVar16 = iVar15;
        }
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",
               uVar11 & 0xffffffff,pcVar12,(ulong)(iVar16 + 1));
      }
      puts(
          "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ..."
          );
      pcVar12 = "";
      for (uVar11 = 0; uVar11 != 0x36; uVar11 = uVar11 + 1) {
        iVar16 = (int)uVar11;
        pVVar6 = (Vec_Wrd_t *)Vec_PtrEntry(p_02,iVar16);
        pVVar9 = (Vec_Wrd_t *)Vec_PtrEntry(p_03,iVar16);
        uVar18 = p->nObjs[uVar11];
        if (uVar18 != 0) {
          pcVar19 = Wlc_Names[uVar11];
          uVar2 = Vec_IntEntry(p_01,iVar16);
          printf("%2d  :  %-8s  %6d%8d ",uVar11 & 0xffffffff,pcVar19,(ulong)uVar18,(ulong)uVar2);
          Wlc_NtkPrintDistribSortOne(p_02,p_03,iVar16);
          for (uVar18 = 0; (int)uVar18 < pVVar6->nSize; uVar18 = uVar18 + 1) {
            wVar20 = Vec_WrdEntry(pVVar6,uVar18);
            if ((((uVar18 / 6) * 6 + 5 == uVar18) && (0x3ffffffffff < wVar20)) ||
               (((~uVar18 & 7) == 0 && (wVar20 < 0x40000000000)))) {
              printf("\n                                ");
            }
            uVar2 = (uint)(wVar20 >> 0x15) & 0x1fffff;
            uVar4 = (uint)wVar20 & 0x1fffff;
            wVar10 = Vec_WrdEntry(pVVar9,uVar18);
            printf("(%d)",wVar10 & 0xffffffff);
            iVar16 = Abc_LitIsCompl(uVar4);
            pcVar19 = "-";
            if (iVar16 == 0) {
              pcVar19 = pcVar12;
            }
            uVar4 = Abc_Lit2Var(uVar4);
            printf("%s%d",pcVar19,(ulong)uVar4);
            if ((wVar20 >> 0x15 & 0x1fffff) != 0) {
              iVar16 = Abc_LitIsCompl(uVar2);
              pcVar19 = "-";
              if (iVar16 == 0) {
                pcVar19 = pcVar12;
              }
              uVar2 = Abc_Lit2Var(uVar2);
              printf("=%s%d",pcVar19,(ulong)uVar2);
            }
            if (0x3ffffffffff < wVar20) {
              uVar2 = (uint)(wVar20 >> 0x20);
              iVar16 = Abc_LitIsCompl(uVar2 >> 10);
              pcVar19 = "-";
              if (iVar16 == 0) {
                pcVar19 = pcVar12;
              }
              uVar2 = Abc_Lit2Var(uVar2 >> 10);
              printf(".%s%d",pcVar19,(ulong)uVar2);
            }
            putchar(0x20);
          }
          putchar(10);
        }
      }
      Vec_VecFree((Vec_Vec_t *)p_02);
      Vec_VecFree((Vec_Vec_t *)p_03);
      Vec_IntFree(p_01);
      return;
    }
    p_04 = Wlc_NtkObj(p,uVar18);
    uVar2 = Wlc_ObjSign(p_04);
    if (0x1fffff < uVar2) {
      iVar3 = p_04->End - p_04->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",(ulong)uVar18,
             (ulong)(iVar15 + 1U),(ulong)(iVar15 + 1U & 0xfffff));
    }
    pWVar7 = p_04;
    if (pWVar8 != (Wlc_Obj_t *)0x0) {
      pWVar7 = pWVar8;
    }
    bVar21 = p_04->Beg != 0;
    if (!bVar21) {
      pWVar7 = pWVar8;
    }
    if ((*(ushort *)p_04 & 0x3d) == 1) {
LAB_002cb44c:
      uVar2 = Wlc_ObjSign(p_04);
      wVar20 = (word)uVar2;
    }
    else {
      uVar2 = *(ushort *)p_04 & 0x3f;
      if (uVar2 < 0x36) {
        if ((0x24000007408080U >> uVar2 & 1) == 0) {
          if ((0x800040UL >> uVar2 & 1) != 0) goto LAB_002cb44c;
          goto LAB_002cb570;
        }
      }
      else {
LAB_002cb570:
        if (p_04->nFanins != 1) {
          if ((int)p_04->nFanins < 2) {
            __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                          ,0x155,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int)");
          }
          uVar2 = Wlc_ObjSign(p_04);
          pWVar8 = Wlc_ObjFanin0(p,p_04);
          uVar4 = Wlc_ObjSign(pWVar8);
          pWVar8 = Wlc_ObjFanin1(p,p_04);
          uVar5 = Wlc_ObjSign(pWVar8);
          wVar20 = (ulong)uVar2 | (ulong)uVar5 << 0x2a | (ulong)uVar4 << 0x15;
          goto LAB_002cb4a4;
        }
      }
      uVar2 = Wlc_ObjSign(p_04);
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      uVar4 = Wlc_ObjSign(pWVar8);
      wVar20 = (ulong)uVar2 | (ulong)uVar4 << 0x15;
    }
LAB_002cb4a4:
    iVar16 = iVar16 + (uint)bVar21;
    uVar1 = *(ushort *)p_04;
    pVVar6 = (Vec_Wrd_t *)Vec_PtrEntry(p_02,uVar1 & 0x3f);
    pVVar9 = (Vec_Wrd_t *)Vec_PtrEntry(p_03,uVar1 & 0x3f);
    for (lVar17 = 0; iVar15 = (int)lVar17, iVar15 < pVVar6->nSize; lVar17 = lVar17 + 1) {
      wVar10 = Vec_WrdEntry(pVVar6,iVar15);
      if (wVar10 == wVar20) {
        if (pVVar9->nSize <= iVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x1bf,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
        }
        pVVar9->pArray[lVar17] = pVVar9->pArray[lVar17] + 1;
        goto LAB_002cb517;
      }
    }
    Vec_WrdPush(pVVar6,wVar20);
    Vec_WrdPush(pVVar9,1);
LAB_002cb517:
    switch(*(ushort *)p_04 & 0x3f) {
    case 8:
      iVar3 = p_04->End - p_04->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = (p_04->nFanins - 2) * (iVar15 * 3 + 3);
      iVar3 = 8;
      break;
    case 9:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      iVar14 = p_04->End - p_04->Beg;
      iVar15 = -iVar14;
      if (0 < iVar14) {
        iVar15 = iVar14;
      }
      iVar14 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar3 + 1;
      if (iVar14 <= iVar3 + 1) {
        iVar15 = iVar14;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 9;
      break;
    case 10:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 10;
      break;
    case 0xb:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xb;
      break;
    case 0xc:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xc;
      break;
    case 0xd:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xd;
      break;
    case 0xe:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xe;
      break;
    case 0xf:
      iVar3 = 0xf;
      goto LAB_002cba09;
    case 0x10:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x10;
      break;
    case 0x11:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x11;
      break;
    case 0x12:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3 + 3;
      iVar3 = 0x12;
      break;
    case 0x13:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x13;
      break;
    case 0x14:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x14;
      break;
    case 0x15:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3 + 3;
      iVar3 = 0x15;
      break;
    case 0x16:
      iVar3 = 0x16;
      goto LAB_002cba09;
    case 0x17:
      iVar3 = 0x17;
      goto LAB_002cba09;
    case 0x18:
      iVar3 = 0x18;
      goto LAB_002cba09;
    case 0x19:
      iVar3 = 0x19;
LAB_002cba09:
      iVar15 = 0;
      break;
    case 0x1a:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x1a;
      break;
    case 0x1b:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1b;
      break;
    case 0x1c:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1c;
      break;
    case 0x1d:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1d;
      break;
    case 0x1e:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 3;
      iVar3 = 0x1e;
      break;
    case 0x1f:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 3;
      iVar3 = 0x1f;
      break;
    case 0x20:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 3;
      iVar3 = 0x20;
      break;
    case 0x21:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x21;
      break;
    case 0x22:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x22;
      break;
    case 0x23:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x23;
      break;
    case 0x24:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x24;
      break;
    case 0x25:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x25;
      break;
    case 0x26:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x26;
      break;
    case 0x27:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 0x27;
      break;
    case 0x28:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x28;
      break;
    case 0x29:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x29;
      break;
    case 0x2a:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 0x2a;
      break;
    case 0x2b:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 9 + 9;
      iVar3 = 0x2b;
      break;
    case 0x2c:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 9 + 9;
      iVar3 = 0x2c;
      break;
    case 0x2d:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 9 + 9);
      iVar3 = 0x2d;
      break;
    case 0x2e:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -0x13 + -9;
      iVar3 = 0x2e;
      break;
    case 0x2f:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -7 + -9;
      iVar3 = 0x2f;
      break;
    case 0x30:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -7 + -9;
      iVar3 = 0x30;
      break;
    case 0x31:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      dVar22 = pow((double)(iVar15 + 1),(double)(iVar3 + 1));
      iVar15 = (int)dVar22 * 10;
      iVar3 = 0x31;
      break;
    case 0x32:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 4;
      iVar3 = 0x32;
      break;
    case 0x33:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar8->End - pWVar8->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = ((uint)((iVar3 + 1) * (iVar15 * 0xb + 0xb)) >> 3) + (iVar14 * 5 + 5U >> 1) + -5;
      iVar3 = 0x33;
      break;
    case 0x34:
      pWVar8 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar8->End - pWVar8->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar8 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar8->End - pWVar8->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 5 + 5);
      iVar3 = 0x34;
      break;
    default:
      goto switchD_002cb53c_default;
    }
    Vec_IntAddToEntry(p_01,iVar3,iVar15);
switchD_002cb53c_default:
    uVar18 = uVar18 + 1;
    pWVar8 = pWVar7;
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fVerbose )
{
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign;
    int i, k, s, s0, s1;
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, Wlc_Names[i], p->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}